

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR set_assign_pos(lyxp_set *set,lyd_node *root,lyxp_node_type root_type)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t local_40;
  uint local_3c;
  uint32_t tmp_pos;
  uint32_t i;
  lyd_node *tmp_node;
  lyd_node *prev;
  lyd_node *plStack_20;
  lyxp_node_type root_type_local;
  lyd_node *root_local;
  lyxp_set *set_local;
  
  tmp_node = (lyd_node *)0x0;
  local_40 = 0;
  local_3c = 0;
  prev._4_4_ = root_type;
  plStack_20 = root;
  root_local = (lyd_node *)set;
  do {
    if (*(uint *)&root_local->prev <= local_3c) {
      return LY_SUCCESS;
    }
    if (*(int *)((long)&root_local->parent->field_0 + (ulong)local_3c * 0x10 + 0xc) == 0) {
      _tmp_pos = (lyd_node *)0x0;
      iVar1 = *(int *)((long)&root_local->parent->field_0 + (ulong)local_3c * 0x10 + 8);
      if (1 < iVar1 - 3U) {
        if (iVar1 != 5) goto LAB_0021a597;
        _tmp_pos = (lyd_node *)
                   **(long **)((long)&root_local->parent->field_0 + (ulong)local_3c * 0x10);
        if (_tmp_pos == (lyd_node *)0x0) {
          ly_log(plStack_20->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                 0x610);
          return LY_EINT;
        }
      }
      if (_tmp_pos == (lyd_node *)0x0) {
        _tmp_pos = *(lyd_node **)((long)&root_local->parent->field_0 + (ulong)local_3c * 0x10);
      }
      uVar2 = get_node_pos(_tmp_pos,*(lyxp_node_type *)
                                     ((long)&root_local->parent->field_0 +
                                     (ulong)local_3c * 0x10 + 8),plStack_20,prev._4_4_,&tmp_node,
                           &local_40);
      *(uint32_t *)((long)&root_local->parent->field_0 + (ulong)local_3c * 0x10 + 0xc) = uVar2;
    }
LAB_0021a597:
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

static LY_ERR
set_assign_pos(struct lyxp_set *set, const struct lyd_node *root, enum lyxp_node_type root_type)
{
    const struct lyd_node *prev = NULL, *tmp_node;
    uint32_t i, tmp_pos = 0;

    for (i = 0; i < set->used; ++i) {
        if (!set->val.nodes[i].pos) {
            tmp_node = NULL;
            switch (set->val.nodes[i].type) {
            case LYXP_NODE_META:
                tmp_node = set->val.meta[i].meta->parent;
                if (!tmp_node) {
                    LOGINT_RET(root->schema->module->ctx);
                }
            /* fall through */
            case LYXP_NODE_ELEM:
            case LYXP_NODE_TEXT:
                if (!tmp_node) {
                    tmp_node = set->val.nodes[i].node;
                }
                set->val.nodes[i].pos = get_node_pos(tmp_node, set->val.nodes[i].type, root, root_type, &prev, &tmp_pos);
                break;
            default:
                /* all roots have position 0 */
                break;
            }
        }
    }

    return LY_SUCCESS;
}